

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

Mesh * Omega_h::read_mesh_file(Mesh *__return_storage_ptr__,path *path,CommPtr *comm)

{
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  char cVar3;
  Library *pLVar4;
  value_type *pvVar5;
  char *format;
  string extension;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_238;
  ifstream stream;
  
  filesystem::path::extension((path *)&stream,path);
  filesystem::path::string_abi_cxx11_(&extension,(path *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  bVar2 = std::operator==(&extension,".osh");
  if (bVar2) {
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_238,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    binary::read((binary *)__return_storage_ptr__,(int)path,&local_238,0);
    p_Var1 = &local_238;
  }
  else {
    bVar2 = std::operator==(&extension,".meshb");
    if (bVar2) {
      format = "Omega_h: Can\'t read %s without reconfiguring with OMEGA_H_USE_libMeshb=ON\n";
LAB_0028eaaa:
      pvVar5 = filesystem::path::c_str(path);
      fail(format,pvVar5);
    }
    bVar2 = std::operator==(&extension,".exo");
    format = "Omega_h: Can\'t read %s without reconfiguring with OMEGA_H_USE_SEACASExodus=ON\n";
    if (bVar2) goto LAB_0028eaaa;
    bVar2 = std::operator==(&extension,".e");
    if (bVar2) goto LAB_0028eaaa;
    bVar2 = std::operator==(&extension,".g");
    if (bVar2) goto LAB_0028eaaa;
    bVar2 = std::operator==(&extension,".msh");
    if (!bVar2) {
      bVar2 = std::operator==(&extension,".pvtu");
      if (bVar2) {
        pLVar4 = Comm::library((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
        Mesh::Mesh(__return_storage_ptr__,pLVar4);
        std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_258,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
        vtk::read_parallel(path,(CommPtr *)&local_258,__return_storage_ptr__);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
        Mesh::set_comm(__return_storage_ptr__,comm);
      }
      else {
        bVar2 = std::operator==(&extension,".vtu");
        if (!bVar2) {
          pvVar5 = filesystem::path::c_str(path);
          fail("Unknown file extension \"%s\" on \"%s\"\n",extension._M_dataplus._M_p,pvVar5);
        }
        pLVar4 = Comm::library((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
        Mesh::Mesh(__return_storage_ptr__,pLVar4);
        pvVar5 = filesystem::path::c_str(path);
        std::ifstream::ifstream(&stream,pvVar5,_S_in);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          fail("assertion %s failed at %s +%d\n","stream.is_open()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
               ,0x2ae);
        }
        std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_268,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
        vtk::read_vtu((istream *)&stream,(CommPtr *)&local_268,__return_storage_ptr__);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
        std::ifstream::~ifstream(&stream);
      }
      goto LAB_0028e9a2;
    }
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_248,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    gmsh::read((int)__return_storage_ptr__,path,(size_t)&local_248);
    p_Var1 = &local_248;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
LAB_0028e9a2:
  std::__cxx11::string::~string((string *)&extension);
  return __return_storage_ptr__;
}

Assistant:

OMEGA_H_DLL Mesh read_mesh_file(filesystem::path const& path, CommPtr comm) {
  auto const extension = path.extension().string();
  if (extension == ".osh") {
    return binary::read(path, comm);
  } else if (extension == ".meshb") {
#ifdef OMEGA_H_USE_LIBMESHB
    Mesh mesh(comm->library());
    meshb::read(&mesh, path.c_str());
    mesh.set_comm(comm);
    return mesh;
#else
    Omega_h_fail(
        "Omega_h: Can't read %s without reconfiguring with "
        "OMEGA_H_USE_libMeshb=ON\n",
        path.c_str());
    OMEGA_H_NORETURN(Mesh());
#endif
  } else if (extension == ".exo" || extension == ".e" || extension == ".g") {
#ifdef OMEGA_H_USE_SEACASEXODUS
    Mesh mesh(comm->library());
    auto file = exodus::open(path);
    exodus::read_mesh(file, &mesh);
    mesh.set_comm(comm);
    exodus::close(file);
    return mesh;
#else
    Omega_h_fail(
        "Omega_h: Can't read %s without reconfiguring with "
        "OMEGA_H_USE_SEACASExodus=ON\n",
        path.c_str());
    OMEGA_H_NORETURN(Mesh());
#endif
  } else if (extension == ".msh") {
    return gmsh::read(path, comm);
  } else if (extension == ".pvtu") {
    Mesh mesh(comm->library());
    vtk::read_parallel(path, comm, &mesh);
    mesh.set_comm(comm);
    return mesh;
  } else if (extension == ".vtu") {
    Mesh mesh(comm->library());
    std::ifstream stream(path.c_str());
    OMEGA_H_CHECK(stream.is_open());
    vtk::read_vtu(stream, comm, &mesh);
    return mesh;
  } else {
    Omega_h_fail("Unknown file extension \"%s\" on \"%s\"\n", extension.c_str(),
        path.c_str());
  }
}